

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreply.cpp
# Opt level: O0

void __thiscall QNetworkReply::setAttribute(QNetworkReply *this,Attribute code,QVariant *value)

{
  bool bVar1;
  QNetworkReplyPrivate *pQVar2;
  long in_FS_OFFSET;
  QNetworkReplyPrivate *d;
  undefined1 in_stack_ffffffffffffffc8 [16];
  char local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QNetworkReply *)0x1e32ee);
  bVar1 = QVariant::isValid(in_stack_ffffffffffffffc8._8_8_);
  if (bVar1) {
    QHash<QNetworkRequest::Attribute,_QVariant>::insert
              (in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_,(QVariant *)0x1e3322)
    ;
  }
  else {
    QHash<QNetworkRequest::Attribute,_QVariant>::remove
              (&(pQVar2->super_QNetworkHeadersPrivate).attributes,local_c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReply::setAttribute(QNetworkRequest::Attribute code, const QVariant &value)
{
    Q_D(QNetworkReply);
    if (value.isValid())
        d->attributes.insert(code, value);
    else
        d->attributes.remove(code);
}